

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O3

void __thiscall
re2c::Skeleton::Skeleton
          (Skeleton *this,dfa_t *dfa,charset_t *cs,rules_t *rs,string *dfa_name,string *dfa_cond,
          uint32_t dfa_line)

{
  uint uVar1;
  pointer pcVar2;
  dfa_state_t *pdVar3;
  size_t *psVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  uint32_t uVar9;
  _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  *p_Var10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  uint uVar14;
  Node *pNVar15;
  ulong uVar16;
  ulong uVar17;
  Node *this_00;
  ulong uVar18;
  dfa_t *pdVar19;
  vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
  arcs;
  string local_98;
  rules_t *local_70;
  _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  *local_68;
  string *local_60;
  dfa_t *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  pair<re2c::Node_*,_unsigned_int> local_40;
  
  local_48 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (dfa_name->_M_dataplus)._M_p;
  local_68 = &rs->_M_t;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + dfa_name->_M_string_length);
  local_60 = &this->cond;
  local_50 = &(this->cond).field_2;
  (this->cond)._M_dataplus._M_p = (pointer)local_50;
  pcVar2 = (dfa_cond->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + dfa_cond->_M_string_length);
  this->line = dfa_line;
  sVar12 = (long)(dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar17 = sVar12 + 1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar17;
  this->nodes_count = sVar12;
  uVar18 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0xb0),8) == 0) {
    uVar18 = SUB168(auVar6 * ZEXT816(0xb0),0) | 8;
  }
  local_58 = dfa;
  local_70 = (rules_t *)operator_new__(uVar18);
  *(ulong *)local_70 = uVar17;
  pNVar15 = (Node *)((long)local_70 + 8);
  if (uVar17 != 0) {
    lVar13 = 0;
    this_00 = pNVar15;
    do {
      Node::Node(this_00);
      lVar13 = lVar13 + -0xb0;
      this_00 = this_00 + 1;
    } while (sVar12 * -0xb0 + -0xb0 != lVar13);
  }
  this->nodes = pNVar15;
  this->sizeof_key = 4;
  local_70 = &this->rules;
  std::
  _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  ::_Rb_tree(&local_70->_M_t,local_68);
  sVar12 = this->nodes_count;
  pNVar15 = this->nodes;
  if (sVar12 != 0) {
    uVar17 = ((long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) - 1;
    p_Var10 = (_Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
               *)0x0;
    pdVar19 = local_58;
    do {
      pdVar3 = (pdVar19->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start[(long)p_Var10];
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      local_68 = p_Var10;
      if (uVar17 != 0) {
        uVar18 = 0;
        do {
          uVar11 = uVar18 + 1;
          if (uVar18 + 1 < uVar17) {
            uVar11 = uVar17;
          }
          psVar4 = pdVar3->arcs;
          sVar5 = psVar4[uVar18];
          uVar16 = uVar18;
          do {
            uVar18 = uVar11;
            if (uVar11 - 1 == uVar16) break;
            uVar18 = uVar16 + 1;
            uVar7 = uVar16 + 1;
            uVar16 = uVar18;
          } while (psVar4[uVar7] == sVar5);
          local_40.first = this->nodes + sVar5;
          if (sVar5 == 0xffffffffffffffff) {
            local_40.first = pNVar15 + sVar12;
          }
          local_40.second =
               (cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar18];
          if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
            std::
            vector<std::pair<re2c::Node*,unsigned_int>,std::allocator<std::pair<re2c::Node*,unsigned_int>>>
            ::_M_realloc_insert<std::pair<re2c::Node*,unsigned_int>>
                      ((vector<std::pair<re2c::Node*,unsigned_int>,std::allocator<std::pair<re2c::Node*,unsigned_int>>>
                        *)&local_98,(iterator)local_98._M_string_length,&local_40);
          }
          else {
            *(Node **)local_98._M_string_length = local_40.first;
            *(ulong *)(local_98._M_string_length + 8) = CONCAT44(local_40._12_4_,local_40.second);
            local_98._M_string_length = local_98._M_string_length + 0x10;
          }
          pdVar19 = local_58;
        } while (uVar18 < uVar17);
      }
      if (((local_98._M_string_length - (long)local_98._M_dataplus._M_p == 0x10) &&
          ((pointer)local_98._M_string_length != local_98._M_dataplus._M_p)) &&
         (*(Node **)local_98._M_dataplus._M_p == pNVar15 + sVar12)) {
        local_98._M_string_length = (size_type)local_98._M_dataplus._M_p;
      }
      Node::init(this->nodes + (long)local_68,(EVP_PKEY_CTX *)(ulong)pdVar3->ctx);
      if ((pair<re2c::Node_*,_unsigned_int> *)local_98._M_dataplus._M_p !=
          (pair<re2c::Node_*,_unsigned_int> *)0x0) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
      }
      p_Var10 = (_Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 *)&(local_68->_M_impl).field_0x1;
    } while (p_Var10 < (undefined1 *)this->nodes_count);
    pNVar15 = this->nodes;
  }
  Node::calc_dist(pNVar15);
  uVar1 = this->nodes->dist;
  if (uVar1 == 0xfffffffe) {
    incond(&local_98,local_60);
    error("DFA path %sis too long",local_98._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_98);
    exit(1);
  }
  if (this->nodes_count == 0) {
    uVar14 = 2;
  }
  else {
    uVar14 = 0;
    uVar17 = 0;
    uVar18 = 1;
    do {
      local_98._M_dataplus._M_p._0_4_ = this->nodes[uVar17].rule.rank.value;
      bVar8 = rule_rank_t::is_none((rule_rank_t *)&local_98);
      if (((!bVar8) && (bVar8 = rule_rank_t::is_def((rule_rank_t *)&local_98), !bVar8)) &&
         (uVar9 = rule_rank_t::uint32((rule_rank_t *)&local_98), uVar14 <= uVar9)) {
        uVar14 = uVar9;
      }
      bVar8 = uVar18 < this->nodes_count;
      uVar17 = uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (bVar8);
    uVar14 = uVar14 + 2;
  }
  if (uVar14 < uVar1) {
    uVar14 = uVar1;
  }
  sVar12 = 1;
  if ((uVar14 < 0x100) || (sVar12 = 2, uVar14 < 0x10000)) {
    this->sizeof_key = sVar12;
  }
  return;
}

Assistant:

Skeleton::Skeleton
	( const dfa_t &dfa
	, const charset_t &cs
	, const rules_t &rs
	, const std::string &dfa_name
	, const std::string &dfa_cond
	, uint32_t dfa_line
	)
	: name (dfa_name)
	, cond (dfa_cond)
	, line (dfa_line)
	, nodes_count (dfa.states.size())
	, nodes (new Node [nodes_count + 1]) // +1 for default state
	, sizeof_key (4)
	, rules (rs)
{
	const size_t nc = cs.size() - 1;

	// initialize skeleton nodes
	Node *nil = &nodes[nodes_count];
	for (size_t i = 0; i < nodes_count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		std::vector<std::pair<Node*, uint32_t> > arcs;
		for (size_t c = 0; c < nc;)
		{
			const size_t j = s->arcs[c];
			for (;++c < nc && s->arcs[c] == j;);
			Node *to = j == dfa_t::NIL
				? nil
				: &nodes[j];
			arcs.push_back(std::make_pair(to, cs[c]));
		}
		// all arcs go to default node => this node is final, drop arcs
		if (arcs.size() == 1 && arcs[0].first == nil)
		{
			arcs.clear();
		}
		nodes[i].init(s->ctx, s->rule, arcs);
	}

	// calculate maximal path length, check overflow
	nodes->calc_dist ();
	const uint32_t maxlen = nodes->dist;
	if (maxlen == Node::DIST_MAX)
	{
		error ("DFA path %sis too long", incond (cond).c_str ());
		exit (1);
	}

	// calculate maximal rule rank (disregarding default and none rules)
	uint32_t maxrule = 0;
	for (uint32_t i = 0; i < nodes_count; ++i)
	{
		const rule_rank_t r = nodes[i].rule.rank;
		if (!r.is_none () && !r.is_def ())
		{
			maxrule = std::max (maxrule, r.uint32 ());
		}
	}
	// two upper values reserved for default and none rules)
	maxrule += 2;

	// initialize size of key
	const uint32_t max = std::max (maxlen, maxrule);
	if (max <= std::numeric_limits<uint8_t>::max())
	{
		sizeof_key = 1;
	}
	else if (max <= std::numeric_limits<uint16_t>::max())
	{
		sizeof_key = 2;
	}
}